

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

Gia_Man_t * Str_NtkToGia(Gia_Man_t *pGia,Str_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int iData0;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Man_t *pGVar4;
  int local_34;
  Str_Obj_t *pSStack_30;
  int k;
  Str_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Str_Ntk_t *p_local;
  Gia_Man_t *pGia_local;
  
  if (pGia->pMuxes != (uint *)0x0) {
    __assert_fail("pGia->pMuxes == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0xb0,"Gia_Man_t *Str_NtkToGia(Gia_Man_t *, Str_Ntk_t *)");
  }
  iVar1 = Gia_ManObjNum(pGia);
  p_00 = Gia_ManStart((iVar1 * 3) / 2);
  pcVar3 = Abc_UtilStrsav(pGia->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(pGia->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManHashStart(p_00);
  pSStack_30 = p->pObjs;
  do {
    iVar1 = Str_ObjId(p,pSStack_30);
    if (p->nObjs <= iVar1) {
      Gia_ManHashStop(p_00);
      iVar1 = Gia_ManRegNum(pGia);
      Gia_ManSetRegNum(p_00,iVar1);
      pGVar4 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar4;
    }
    if (((undefined1  [16])*pSStack_30 & (undefined1  [16])0xf) == (undefined1  [16])0x2) {
      iVar1 = Gia_ManAppendCi(p_00);
      pSStack_30->iCopy = iVar1;
    }
    else if (((undefined1  [16])*pSStack_30 & (undefined1  [16])0xf) == (undefined1  [16])0x3) {
      pSStack_30->iCopy = 1;
      for (local_34 = 0; local_34 < (int)(*(uint *)pSStack_30 >> 4); local_34 = local_34 + 1) {
        iVar1 = pSStack_30->iCopy;
        iVar2 = Str_ObjFaninCopy(p,pSStack_30,local_34);
        iVar1 = Gia_ManHashAnd(p_00,iVar1,iVar2);
        pSStack_30->iCopy = iVar1;
      }
    }
    else if (((undefined1  [16])*pSStack_30 & (undefined1  [16])0xf) == (undefined1  [16])0x4) {
      pSStack_30->iCopy = 0;
      for (local_34 = 0; local_34 < (int)(*(uint *)pSStack_30 >> 4); local_34 = local_34 + 1) {
        iVar1 = pSStack_30->iCopy;
        iVar2 = Str_ObjFaninCopy(p,pSStack_30,local_34);
        iVar1 = Gia_ManHashXor(p_00,iVar1,iVar2);
        pSStack_30->iCopy = iVar1;
      }
    }
    else if (((undefined1  [16])*pSStack_30 & (undefined1  [16])0xf) == (undefined1  [16])0x5) {
      iVar1 = Str_ObjFaninCopy(p,pSStack_30,2);
      iVar2 = Str_ObjFaninCopy(p,pSStack_30,1);
      iData0 = Str_ObjFaninCopy(p,pSStack_30,0);
      iVar1 = Gia_ManHashMux(p_00,iVar1,iVar2,iData0);
      pSStack_30->iCopy = iVar1;
    }
    else if (((undefined1  [16])*pSStack_30 & (undefined1  [16])0xf) == (undefined1  [16])0x7) {
      iVar1 = Str_ObjFaninCopy(p,pSStack_30,0);
      iVar1 = Gia_ManAppendCo(p_00,iVar1);
      pSStack_30->iCopy = iVar1;
    }
    else {
      if (((undefined1  [16])*pSStack_30 & (undefined1  [16])0xf) != (undefined1  [16])0x1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0xcb,"Gia_Man_t *Str_NtkToGia(Gia_Man_t *, Str_Ntk_t *)");
      }
      pSStack_30->iCopy = 0;
    }
    pSStack_30 = pSStack_30 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Str_NtkToGia( Gia_Man_t * pGia, Str_Ntk_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Str_Obj_t * pObj; int k;
    assert( pGia->pMuxes == NULL );
    pNew = Gia_ManStart( 3 * Gia_ManObjNum(pGia) / 2 );
    pNew->pName = Abc_UtilStrsav( pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( pGia->pSpec );
    Gia_ManHashStart( pNew );
    Str_NtkManForEachObj( p, pObj )
    {
        if ( pObj->Type == STR_PI )
            pObj->iCopy = Gia_ManAppendCi( pNew );
        else if ( pObj->Type == STR_AND )
        {
            pObj->iCopy = 1;
            for ( k = 0; k < (int)pObj->nFanins; k++ )
                pObj->iCopy = Gia_ManHashAnd( pNew, pObj->iCopy, Str_ObjFaninCopy(p, pObj, k) );
        }
        else if ( pObj->Type == STR_XOR )
        {
            pObj->iCopy = 0;
            for ( k = 0; k < (int)pObj->nFanins; k++ )
                pObj->iCopy = Gia_ManHashXor( pNew, pObj->iCopy, Str_ObjFaninCopy(p, pObj, k) );
        }
        else if ( pObj->Type == STR_MUX )
            pObj->iCopy = Gia_ManHashMux( pNew, Str_ObjFaninCopy(p, pObj, 2), Str_ObjFaninCopy(p, pObj, 1), Str_ObjFaninCopy(p, pObj, 0) );
        else if ( pObj->Type == STR_PO )
            pObj->iCopy = Gia_ManAppendCo( pNew, Str_ObjFaninCopy(p, pObj, 0) );
        else if ( pObj->Type == STR_CONST0 )
            pObj->iCopy = 0;
        else assert( 0 );
    }
    Gia_ManHashStop( pNew );
//    assert( Gia_ManObjNum(pNew) <= Gia_ManObjNum(pGia) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(pGia) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}